

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlTextReaderPtr xmlReaderForFile(char *filename,char *encoding,int options)

{
  int iVar1;
  xmlTextReaderPtr reader;
  int options_local;
  char *encoding_local;
  char *filename_local;
  
  filename_local = (char *)xmlNewTextReaderFilename(filename);
  if ((xmlTextReaderPtr)filename_local == (xmlTextReaderPtr)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    iVar1 = xmlTextReaderSetup((xmlTextReaderPtr)filename_local,(xmlParserInputBufferPtr)0x0,
                               (char *)0x0,encoding,options);
    if (iVar1 < 0) {
      xmlFreeTextReader((xmlTextReaderPtr)filename_local);
      filename_local = (char *)0x0;
    }
  }
  return (xmlTextReaderPtr)filename_local;
}

Assistant:

xmlTextReaderPtr
xmlReaderForFile(const char *filename, const char *encoding, int options)
{
    xmlTextReaderPtr reader;

    reader = xmlNewTextReaderFilename(filename);
    if (reader == NULL)
        return (NULL);
    if (xmlTextReaderSetup(reader, NULL, NULL, encoding, options) < 0) {
        xmlFreeTextReader(reader);
        return (NULL);
    }
    return (reader);
}